

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,BaseTextGenerator *generator)

{
  Finder *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Descriptor *type;
  MessageLite *pMVar4;
  FastFieldValuePrinter *pFVar5;
  LogMessage *pLVar6;
  string *in_R8;
  Metadata MVar7;
  string_view type_url;
  string_view data;
  string_view str;
  string_view str_00;
  string_view str_01;
  FieldDescriptor *value_field;
  string full_type_name;
  string url_prefix;
  FieldDescriptor *type_url_field;
  string serialized_value;
  DynamicMessageFactory factory;
  FieldDescriptor *local_110;
  string local_108;
  string local_e8;
  string local_c8;
  LogMessage local_a8;
  FieldDescriptor *local_98;
  string local_90;
  DynamicMessageFactory local_70;
  
  bVar2 = internal::GetAnyFieldDescriptors(message,&local_98,&local_110);
  if (!bVar2) {
    return false;
  }
  MVar7 = Message::GetMetadata(message);
  Reflection::GetString_abi_cxx11_(&local_c8,MVar7.reflection,message,local_98);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  type_url._M_str = (char *)&local_e8;
  type_url._M_len = (size_t)local_c8._M_dataplus._M_p;
  bVar2 = internal::ParseAnyTypeUrl((internal *)local_c8._M_string_length,type_url,&local_108,in_R8)
  ;
  if (bVar2) {
    pFVar1 = this->finder_;
    if (pFVar1 == (Finder *)0x0) {
      type = anon_unknown_14::DefaultFinderFindAnyType(message,&local_e8,&local_108);
    }
    else {
      iVar3 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,&local_e8,&local_108);
      type = (Descriptor *)CONCAT44(extraout_var,iVar3);
    }
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&local_70);
      pMVar4 = &DynamicMessageFactory::GetPrototype(&local_70,type)->super_MessageLite;
      pMVar4 = MessageLite::New(pMVar4,(Arena *)0x0);
      Reflection::GetString_abi_cxx11_(&local_90,MVar7.reflection,message,local_110);
      data._M_str = local_90._M_dataplus._M_p;
      data._M_len = local_90._M_string_length;
      bVar2 = MessageLite::ParseFromString(pMVar4,data);
      if (bVar2) {
        (*generator->_vptr_BaseTextGenerator[5])(generator,"[",1);
        (*generator->_vptr_BaseTextGenerator[5])
                  (generator,local_c8._M_dataplus._M_p,local_c8._M_string_length);
        (*generator->_vptr_BaseTextGenerator[5])(generator,"]",1);
        pFVar5 = GetFieldPrinter(this,local_110);
        (*pFVar5->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar5,message,0xffffffff,0,(ulong)this->single_line_mode_,generator);
        (*generator->_vptr_BaseTextGenerator[2])(generator);
        Print(this,(Message *)pMVar4,generator);
        (*generator->_vptr_BaseTextGenerator[3])(generator);
        (*pFVar5->_vptr_FastFieldValuePrinter[0x10])
                  (pFVar5,message,0xffffffff,0,(ulong)this->single_line_mode_,generator);
      }
      else {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                   ,0x91a);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_a8,&local_c8);
        str_01._M_str = ": failed to parse contents";
        str_01._M_len = 0x1a;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar6,str_01);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      (*pMVar4->_vptr_MessageLite[1])(pMVar4);
      DynamicMessageFactory::~DynamicMessageFactory(&local_70);
      goto LAB_002acfb0;
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              ((LogMessage *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x911);
    str._M_str = "Can\'t print proto content: proto type ";
    str._M_len = 0x26;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_70,str);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)&local_70,&local_c8);
    str_00._M_str = " not found";
    str_00._M_len = 10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar6,str_00);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_70);
  }
  bVar2 = false;
LAB_002acfb0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   BaseTextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;

  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    ABSL_LOG(WARNING) << "Can't print proto content: proto type " << type_url
                      << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    ABSL_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}